

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

MetadataPointer __thiscall
duckdb::MetadataManager::RegisterDiskPointer(MetadataManager *this,MetaBlockPointer pointer)

{
  MetadataPointer MVar1;
  undefined8 extraout_RDX;
  MetaBlockPointer pointer_00;
  MetadataBlock block;
  MetadataBlock MStack_78;
  MetadataBlock local_48;
  
  pointer_00.block_pointer = pointer.block_pointer;
  local_48.block_id = pointer_00.block_pointer & 0xffffffffffffff;
  local_48.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_48.block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.free_blocks.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MetadataBlock::MetadataBlock(&MStack_78,&local_48);
  AddAndRegisterBlock(this,&MStack_78);
  MetadataBlock::~MetadataBlock(&MStack_78);
  pointer_00.offset = (int)extraout_RDX;
  pointer_00.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
  MVar1 = FromDiskPointer(this,pointer_00);
  MetadataBlock::~MetadataBlock(&local_48);
  return MVar1;
}

Assistant:

MetadataPointer MetadataManager::RegisterDiskPointer(MetaBlockPointer pointer) {
	auto block_id = pointer.GetBlockId();
	MetadataBlock block;
	block.block_id = block_id;
	AddAndRegisterBlock(block);
	return FromDiskPointer(pointer);
}